

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O0

int funchook_unprotect_end(funchook_t *funchook,mem_state_t *mstate)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 *in_RSI;
  funchook_t *in_RDI;
  int rv;
  char errbuf [128];
  undefined8 uVar4;
  int local_4;
  
  iVar2 = mprotect((void *)*in_RSI,in_RSI[1],5);
  if (iVar2 == 0) {
    funchook_log(in_RDI,"  protect memory %p (size=%lu, prot=read,exec)\n",*in_RSI,in_RSI[1]);
    local_4 = 0;
  }
  else {
    uVar4 = *in_RSI;
    uVar1 = in_RSI[1];
    __errno_location();
    pcVar3 = funchook_strerror((int)((ulong)uVar4 >> 0x20),(char *)in_RDI,0x103570);
    funchook_set_error_message
              (in_RDI,"Failed to protect memory %p (size=%lu, prot=read,exec, error=%s)",uVar4,uVar1
               ,pcVar3);
    local_4 = 9;
  }
  return local_4;
}

Assistant:

int funchook_unprotect_end(funchook_t *funchook, const mem_state_t *mstate)
{
    char errbuf[128];
    int rv = mprotect(mstate->addr, mstate->size, PROT_READ | PROT_EXEC);

    if (rv == 0) {
        funchook_log(funchook, "  protect memory %p (size=%"PRIuPTR", prot=read,exec)\n",
                     mstate->addr, mstate->size);
        return 0;
    }
    funchook_set_error_message(funchook, "Failed to protect memory %p (size=%"PRIuPTR", prot=read,exec, error=%s)",
                               mstate->addr, mstate->size,
                               funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_FUNCTION;
}